

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2gal.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CESkyCoord gal_coord;
  CESkyCoord cirs_coord;
  CEDate date;
  CEExecOptions opts;
  allocator local_3da;
  allocator local_3d9;
  CEAngle local_3d8 [16];
  CEAngle local_3c8 [20];
  CESkyCoordType local_3b4;
  string local_3b0;
  double local_380;
  double local_378;
  allocator local_370 [48];
  string local_340 [5];
  CEDate local_290 [64];
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_340,"juliandate",local_370);
    dVar2 = CLOptions::AsDouble(&local_250.super_CLOptions,local_340);
    CEDate::CEDate(local_290,dVar2,JD);
    std::__cxx11::string::~string((string *)local_340);
    std::__cxx11::string::string((string *)local_340,"ra",&local_3d9);
    local_378 = CLOptions::AsDouble(&local_250.super_CLOptions,local_340);
    CEAngle::Deg((double *)local_3c8);
    std::__cxx11::string::string((string *)&local_3b0,"dec",&local_3da);
    local_380 = CLOptions::AsDouble(&local_250.super_CLOptions,&local_3b0);
    CEAngle::Deg((double *)local_3d8);
    local_3b4 = CIRS;
    CESkyCoord::CESkyCoord((CESkyCoord *)local_370,local_3c8,local_3d8,&local_3b4);
    CEAngle::~CEAngle(local_3d8);
    std::__cxx11::string::~string((string *)&local_3b0);
    CEAngle::~CEAngle(local_3c8);
    std::__cxx11::string::~string((string *)local_340);
    CEObserver::CEObserver((CEObserver *)local_340);
    CESkyCoord::ConvertToGalactic((CEDate *)&local_3b0,(CEObserver *)local_370);
    CEObserver::~CEObserver((CEObserver *)local_340);
    PrintResults(&local_250,(CESkyCoord *)&local_3b0);
    CESkyCoord::~CESkyCoord((CESkyCoord *)&local_3b0);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_370);
    CEDate::~CEDate(local_290);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
{    
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Convert the coordinates
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);
    CESkyCoord cirs_coord(CEAngle::Deg(opts.AsDouble("ra")),
                          CEAngle::Deg(opts.AsDouble("dec")),
                          CESkyCoordType::CIRS);
    CESkyCoord gal_coord = cirs_coord.ConvertToGalactic(date);
    
    // Print the results
    PrintResults(opts, gal_coord);
    
    return 0 ;
}